

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O2

uint RDL_getNofNodesForRingsystem(RDL_data *data,uint idx)

{
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
  }
  else {
    if (idx < data->bccGraphs->nof_bcc) {
      return data->bccGraphs->bcc_graphs[idx]->V;
    }
    (*RDL_outputFunc)(RDL_ERROR,"idx %d is out of range!\n");
  }
  return 0xffffffff;
}

Assistant:

unsigned RDL_getNofNodesForRingsystem(const RDL_data *data, unsigned idx)
{
  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    return RDL_INVALID_RESULT;
  }

  if(idx >= data->bccGraphs->nof_bcc) {
    RDL_outputFunc(RDL_ERROR, "idx %d is out of range!\n", idx);
    return RDL_INVALID_RESULT;
  }

  return data->bccGraphs->bcc_graphs[idx]->V;
}